

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O0

int64_t getPSDuration(char *fileName)

{
  byte bVar1;
  bool bVar2;
  uint8_t *buffer;
  ssize_t sVar3;
  uint8_t *end;
  int64_t iVar4;
  size_t __nbytes;
  uint __fd;
  char *local_108;
  bool local_f9;
  uint local_b4;
  int bufferSize;
  int64_t lastPcrVal;
  uint8_t startcode;
  PESPacket *pesPacket;
  uint8_t *bufEnd;
  int64_t firstPcrVal;
  uint8_t *curPtr;
  int len;
  uint8_t *tmpBuffer;
  undefined1 local_60 [8];
  File file;
  int64_t fileSize;
  int BUF_SIZE;
  char *fileName_local;
  
  __nbytes = 0;
  File::File((File *)local_60,fileName,1,0);
  bVar2 = File::size((File *)local_60,&file.m_pos);
  if (bVar2) {
    buffer = (uint8_t *)operator_new__(0x40000);
    sVar3 = File::read((File *)local_60,(int)buffer,(void *)0x40000,__nbytes);
    if ((int)sVar3 < 1) {
      if (buffer != (uint8_t *)0x0) {
        operator_delete__(buffer);
      }
      fileName_local = (char *)0x0;
    }
    else {
      bufEnd = (uint8_t *)0x0;
      end = buffer + (int)sVar3;
      for (firstPcrVal = (int64_t)MPEGHeader::findNextMarker(buffer,end);
          (ulong)firstPcrVal <= end + -9;
          firstPcrVal = (int64_t)MPEGHeader::findNextMarker((uint8_t *)(firstPcrVal + 4),end)) {
        bVar1 = *(byte *)(firstPcrVal + 3);
        if (((((0xbf < bVar1) && (bVar1 < 0xf0)) || (bVar1 == 0xbd)) ||
            ((bVar1 == 0xfd || (bVar1 == 0xbf)))) && ((*(byte *)(firstPcrVal + 7) & 0x80) == 0x80))
        {
          bufEnd = (uint8_t *)PESPacket::getPts((PESPacket *)firstPcrVal);
          break;
        }
      }
      if (buffer != (uint8_t *)0x0) {
        operator_delete__(buffer);
      }
      local_b4 = 0x40000;
      do {
        __fd = local_b4;
        iVar4 = getLastPCR((File *)local_60,local_b4,file.m_pos);
        local_b4 = local_b4 << 2;
        local_f9 = iVar4 == -1 && local_b4 < 0x100001;
      } while (local_f9);
      File::close((File *)local_60,__fd);
      if (iVar4 < 0) {
        local_108 = (char *)0x0;
      }
      else {
        local_108 = (char *)(iVar4 - (long)bufEnd);
      }
      fileName_local = local_108;
    }
  }
  else {
    fileName_local = (char *)0x0;
  }
  File::~File((File *)local_60);
  return (int64_t)fileName_local;
}

Assistant:

int64_t getPSDuration(const char* fileName)
{
    constexpr int BUF_SIZE = 1024 * 256;

    try
    {
        int64_t fileSize;
        File file(fileName, File::ofRead);
        if (!file.size(&fileSize))
            return 0;

        const auto tmpBuffer = new uint8_t[BUF_SIZE];

        // pcr from start of file
        const int len = file.read(tmpBuffer, BUF_SIZE);
        if (len < 1)
        {
            delete[] tmpBuffer;
            return 0;
        }
        uint8_t* curPtr = tmpBuffer;
        int64_t firstPcrVal = 0;
        uint8_t* bufEnd = tmpBuffer + len;
        curPtr = MPEGHeader::findNextMarker(curPtr, bufEnd);
        while (curPtr <= bufEnd - 9)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(curPtr);
            const uint8_t startcode = curPtr[3];
            if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) ||
                (startcode == PES_VC1_ID) || (startcode == PES_PRIVATE_DATA2))
            {
                if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    firstPcrVal = pesPacket->getPts();
                    break;
                }
            }
            curPtr = MPEGHeader::findNextMarker(curPtr + 4, bufEnd);
        }
        delete[] tmpBuffer;

        // pcr from end of file

        int64_t lastPcrVal;
        int bufferSize = BUF_SIZE;
        do
        {
            lastPcrVal = getLastPCR(file, bufferSize, fileSize);
            bufferSize *= 4;
        } while (lastPcrVal == -1 && bufferSize <= 1024 * 1024);

        file.close();

        return lastPcrVal >= 0 ? lastPcrVal - firstPcrVal : 0;
    }
    catch (...)
    {
        return 0;
    }
}